

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelMapping.cpp
# Opt level: O2

void __thiscall
ObservationModelMapping::ObservationModelMapping
          (ObservationModelMapping *this,ObservationModelMapping *OM)

{
  pointer ppmVar1;
  int iVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  uint uVar3;
  Matrix *O;
  
  uVar3 = 0;
  (this->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
  super_ObservationModel._vptr_ObservationModel =
       (_func_int **)&PTR__ObservationModelDiscrete_00606bd0;
  iVar2 = (OM->super_ObservationModelDiscrete)._m_nrJointActions;
  (this->super_ObservationModelDiscrete)._m_nrStates =
       (OM->super_ObservationModelDiscrete)._m_nrStates;
  (this->super_ObservationModelDiscrete)._m_nrJointActions = iVar2;
  (this->super_ObservationModelDiscrete)._m_nrJointObservations =
       (OM->super_ObservationModelDiscrete)._m_nrJointObservations;
  (this->super_ObservationModelDiscrete).super_ObservationModelDiscreteInterface.
  super_ObservationModel._vptr_ObservationModel =
       (_func_int **)&PTR__ObservationModelMapping_00606cb8;
  (this->_m_O).
  super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_O).
  super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_O).
  super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    ppmVar1 = (OM->_m_O).
              super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(OM->_m_O).
              super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppmVar1 >> 3 == (ulong)uVar3)
    break;
    this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)operator_new(0x28);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(this_00,ppmVar1[uVar3]);
    O = this_00;
    std::
    vector<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::push_back(&this->_m_O,&O);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

ObservationModelMapping::
ObservationModelMapping(const ObservationModelMapping& OM) :
    ObservationModelDiscrete(OM)
{
    Matrix *O;
    for(unsigned int a=0;a!=OM._m_O.size();++a)
    {
        O=new Matrix(*OM._m_O[a]);
        _m_O.push_back(O);
    }
}